

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O3

int drop_throw(monst *magr,obj *obj,obj *ostack,boolean thrown,boolean ohit,int x,int y)

{
  short sVar1;
  boolean bVar2;
  schar sVar3;
  uint uVar4;
  char *pcVar5;
  trap *ptVar6;
  int iVar7;
  obj *olaunch;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar8;
  monst *local_40;
  
  if (magr == (monst *)0x0) {
    olaunch = (obj *)0x0;
  }
  else {
    olaunch = magr->mw;
  }
  sVar1 = obj->otyp;
  if ((((long)sVar1 == 0x120) || (obj->oclass == '\x11')) || (ohit != '\0' && sVar1 == 0x10f))
  goto LAB_001f5251;
  if (ohit != '\0') {
    if (obj->oclass == '\x02') {
      if ((sVar1 == 0x213) || ((byte)(objects[sVar1].oc_subtyp + 0x1aU) < 5)) {
LAB_001f52bc:
        uVar4 = mt_random();
        if (0x55555555 < uVar4 * -0x55555555) goto LAB_001f5251;
      }
    }
    else if (sVar1 == 0x213) goto LAB_001f52bc;
  }
  pcVar5 = level->levname + (long)x * 0xa8;
  local_40 = *(monst **)(pcVar5 + (long)y * 8 + 0x8380);
  if (local_40 != (monst *)0x0) {
    uVar4 = *(uint *)&local_40->field_0x60;
    pcVar5 = (char *)(ulong)uVar4;
    if ((uVar4 >> 9 & 1) == 0) {
      if ((uVar4 >> 0x17 & 1) != 0) {
        ptVar6 = t_at(level,x,y);
        if (ptVar6 == (trap *)0x0) {
          uVar8 = 0;
          goto LAB_001f5357;
        }
        if ((byte)((ptVar6->field_0x8 & 0x1f) - 0xb) < 2) {
LAB_001f5251:
          bVar2 = detonate_obj(obj,ostack,olaunch,x,y,thrown);
          if (bVar2 != '\0') {
            return 1;
          }
          obfree(obj,(obj *)0x0);
          return 1;
        }
      }
      uVar8 = 0;
      goto LAB_001f5357;
    }
  }
  uVar8 = (undefined4)CONCAT71((int7)((ulong)pcVar5 >> 8),1);
  local_40 = (monst *)0x0;
LAB_001f5357:
  sVar3 = down_gate((xchar)x,(xchar)y);
  if ((sVar3 != -1) && (bVar2 = ship_object(obj,(xchar)x,(xchar)y,'\0'), bVar2 != '\0')) {
    return 1;
  }
  bVar2 = flooreffects(obj,x,y,"fall");
  iVar7 = 1;
  if ((bVar2 == '\0') && (bVar2 = detonate_obj(obj,ostack,olaunch,x,y,thrown), bVar2 == '\0')) {
    place_object(obj,level,x,y);
    if ((char)uVar8 != '\0') {
      if (u.uy == y && u.ux == x) {
        local_40 = &youmonst;
      }
      else {
        local_40 = (monst *)0x0;
      }
    }
    if ((ohit != '\0') && (local_40 != (monst *)0x0)) {
      passive_obj(local_40,obj,(attack *)0x0);
    }
    stackobj((obj *)CONCAT44(uVar8,in_stack_ffffffffffffffb8));
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int drop_throw(struct monst *magr, struct obj *obj, struct obj *ostack,
		      boolean thrown, boolean ohit, int x, int y)
{
	int retvalu = 1;
	int create;
	struct monst *mtmp;
	struct trap *t;
	struct obj *monwep = (magr ? MON_WEP(magr) : NULL);

	if (obj->otyp == CREAM_PIE || obj->oclass == VENOM_CLASS ||
		    (ohit && obj->otyp == EGG))
		create = 0;
	else if (ohit && (is_multigen(obj) || obj->otyp == ROCK))
		create = !rn2(3);
	else create = 1;

	if (create && !((mtmp = m_at(level, x, y)) && (mtmp->mtrapped) &&
			(t = t_at(level, x, y)) && ((t->ttyp == PIT) ||
			(t->ttyp == SPIKED_PIT)))) {
		int objgone = 0;

		if (down_gate(x, y) != -1)
			objgone = ship_object(obj, x, y, FALSE);
		if (!objgone) {
			if (!flooreffects(obj,x,y,"fall")) { /* don't double-dip on damage */
			    if (detonate_obj(obj, ostack, monwep, x, y, thrown))
				return 1;
			    place_object(obj, level, x, y);
			    if (!mtmp && x == u.ux && y == u.uy)
				mtmp = &youmonst;
			    if (mtmp && ohit)
				passive_obj(mtmp, obj, NULL);
			    stackobj(obj);
			    retvalu = 0;
			}
		}
	} else {
	    if (detonate_obj(obj, ostack, monwep, x, y, thrown))
		return 1;
	    obfree(obj, NULL);
	}

	return retvalu;
}